

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

bool __thiscall
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(ThreadContext *this,DynamicObject *object)

{
  Type TVar1;
  Type pSVar2;
  Type pIVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *ppIVar8;
  DynamicObject *this_00;
  undefined8 uVar9;
  Type *pTVar10;
  Iterator local_60;
  int local_50;
  uint local_4c;
  ThreadContext *local_48;
  ulong local_40;
  byte local_31;
  
  local_31 = (this->storeFieldInlineCacheByPropId).bucketCount != 0;
  if ((bool)local_31) {
    local_31 = 1;
    local_48 = this;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_40 = 0;
    do {
      local_50 = (local_48->storeFieldInlineCacheByPropId).buckets[local_40];
      if (local_50 != -1) {
        uVar9 = 0;
        do {
          local_4c = (uint)uVar9;
          pSVar2 = (local_48->storeFieldInlineCacheByPropId).entries;
          local_60.list =
               &(pSVar2[local_50].
                 super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                 .
                 super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                 .
                 super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .value)->super_SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>;
          local_60.current = &(local_60.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          local_50 = pSVar2[local_50].
                     super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .
                     super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                     .
                     super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                     .
                     super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                     .next;
LAB_007c0686:
          if ((SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current ==
              (SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) {
LAB_007c0858:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar7 = 0;
          }
          local_60.current =
               (((SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)
                &(local_60.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if ((SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current !=
              local_60.list) {
            ppIVar8 = SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                      Data(&local_60);
            pIVar3 = *ppIVar8;
            if ((pIVar3 != (Type)0x0) && (pTVar10 = (pIVar3->u).local.type, pTVar10 != (Type *)0x0))
            {
              if ((undefined1  [24])((undefined1  [24])pIVar3->u & (undefined1  [24])0x1) ==
                  (undefined1  [24])0x0) {
                if ((undefined1  [24])((undefined1  [24])pIVar3->u & (undefined1  [24])0x1) ==
                    (undefined1  [24])0x0) {
                  if ((undefined1  [24])((undefined1  [24])pIVar3->u & (undefined1  [24])0x1) ==
                      (undefined1  [24])0x0) {
                    pTVar10 = (Type *)0x0;
                  }
                  else {
                    pTVar10 = (Type *)(pIVar3->u).proto.prototypeObject;
                  }
                }
                else {
                  pTVar10 = (pIVar3->u).local.typeWithoutProperty;
                }
              }
              this_00 = *(DynamicObject **)(((ulong)pTVar10 & 0xfffffffffffffffb) + 0x10);
              while( true ) {
                if (this_00 == (DynamicObject *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar7 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                  if (!bVar5) goto LAB_007c0858;
                  *puVar7 = 0;
                }
                TVar1 = ((this_00->super_RecyclableObject).type.ptr)->typeId;
                if ((0x57 < (int)TVar1) &&
                   (BVar6 = Js::RecyclableObject::IsExternal(&this_00->super_RecyclableObject),
                   BVar6 == 0)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar7 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                     "GetTypeId aValue has invalid TypeId");
                  if (!bVar5) goto LAB_007c0858;
                  *puVar7 = 0;
                }
                if ((TVar1 == TypeIds_Null) || (TVar1 == TypeIds_Proxy)) goto LAB_007c0686;
                if (this_00 == object) break;
                this_00 = (DynamicObject *)
                          Js::RecyclableObject::GetPrototype(&this_00->super_RecyclableObject);
              }
              if ((TVar1 != TypeIds_Null) && (TVar1 != TypeIds_Proxy)) {
                if ((local_4c & 1) == 0) goto LAB_007c0844;
                break;
              }
            }
            goto LAB_007c0686;
          }
          uVar9 = CONCAT71((int7)((ulong)local_60.current >> 8),local_50 == -1);
        } while (local_50 != -1);
      }
      local_40 = local_40 + 1;
      local_31 = local_40 < (local_48->storeFieldInlineCacheByPropId).bucketCount;
    } while ((bool)local_31);
  }
LAB_007c0844:
  return (bool)(local_31 & 1);
}

Assistant:

bool
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(Js::DynamicObject * object)
{
    return storeFieldInlineCacheByPropId.MapUntil([object](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        FOREACH_SLISTBASE_ENTRY(Js::InlineCache*, inlineCache, inlineCacheList)
        {
            if (inlineCache != nullptr && !inlineCache->IsEmpty())
            {
                // Verify this object is not present in prototype chain of inlineCache's type
                bool isObjectPresentOnPrototypeChain =
                    Js::JavascriptOperators::MapObjectAndPrototypesUntil<true>(inlineCache->GetType()->GetPrototype(), [=](Js::RecyclableObject* prototype)
                {
                    return prototype == object;
                });
                if (isObjectPresentOnPrototypeChain) {
                    return true;
                }
            }
        }
        NEXT_SLISTBASE_ENTRY;
        return false;
    });
}